

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::detail::ExpressionLHS<bool>::GetResult
          (AssertionResult *__return_storage_ptr__,ExpressionLHS<bool> *this,bool expected)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  AssertionResult local_40;
  
  local_40.m_result = this->m_lhs == expected;
  paVar1 = &local_40.m_message.field_2;
  local_40.m_message._M_string_length = 0;
  local_40.m_message.field_2._M_local_buf[0] = '\0';
  local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
  pAVar3 = AssertionResult::operator<<(&local_40,(char (*) [12])"expansion: ");
  pAVar3 = AssertionResult::operator<<(pAVar3,&this->m_message);
  (__return_storage_ptr__->m_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_message).field_2;
  pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length);
  __return_storage_ptr__->m_result = pAVar3->m_result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.m_message._M_dataplus._M_p,
                    CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                             local_40.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(bool expected) const
    {
        const bool b = m_lhs ? true : false;
        return AssertionResult(b == expected) << "expansion: " << m_message;
    }